

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O0

void __thiscall
QUntypedBindable::QUntypedBindable
          (QUntypedBindable *this,QObject *obj,char *property,QBindableInterface *i)

{
  long lVar1;
  anon_class_16_2_d8952eb5 *in_RDX;
  long in_FS_OFFSET;
  QBindableInterface *in_stack_00000080;
  QMetaProperty *in_stack_00000088;
  QObject *in_stack_00000090;
  QUntypedBindable *in_stack_00000098;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QUntypedBindable::anon_class_16_2_d8952eb5::operator()(in_RDX);
  QUntypedBindable(in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUntypedBindable::QUntypedBindable(QObject *obj, const char *property,
                                   const QtPrivate::QBindableInterface *i)
    : QUntypedBindable(
            obj,
            [=]() -> QMetaProperty {
                if (!obj)
                    return {};
                auto propertyIndex = obj->metaObject()->indexOfProperty(property);
                if (propertyIndex < 0) {
                    qCWarning(lcQPropertyBinding)
                            << "QUntypedBindable: No property named" << property;
                    return {};
                }
                return obj->metaObject()->property(propertyIndex);
            }(),
            i)
{
}